

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O2

void __thiscall
TPZMatRed<double,_TPZFMatrix<double>_>::U1
          (TPZMatRed<double,_TPZFMatrix<double>_> *this,TPZFMatrix<double> *F)

{
  TPZFNMatrix<1000,_double> F1Red;
  TPZFNMatrix<1000,_double> K1Red;
  
  TPZFNMatrix<1000,_double>::TPZFNMatrix(&K1Red,this->fDim1,this->fDim1);
  TPZFNMatrix<1000,_double>::TPZFNMatrix
            (&F1Red,this->fDim1,(this->fF1).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol);
  K11Reduced(this,&K1Red.super_TPZFMatrix<double>,&F1Red.super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=(F,&F1Red.super_TPZFMatrix<double>);
  TPZMatrix<double>::SolveDirect((TPZMatrix<double> *)&K1Red,F,ELU);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix(&F1Red);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix(&K1Red);
  return;
}

Assistant:

void TPZMatRed<TVar,TSideMatrix>::U1(TPZFMatrix<TVar> & F)
{
	TPZFNMatrix<1000,TVar> K1Red(fDim1,fDim1), F1Red(fDim1,fF1.Cols());
	K11Reduced(K1Red, F1Red);
	F=(F1Red);
	K1Red.SolveDirect( F ,ELU);
	
	
}